

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

void __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Converter::Converter
          (Converter *this,bool a_bStoreIsUtf8)

{
  (this->super_SI_ConvertA<char>).m_bStoreIsUtf8 = a_bStoreIsUtf8;
  (this->m_scratch)._M_dataplus._M_p = (pointer)&(this->m_scratch).field_2;
  (this->m_scratch)._M_string_length = 0;
  (this->m_scratch).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&this->m_scratch,'\0');
  return;
}

Assistant:

SI_ConvertA(bool a_bStoreIsUtf8) : m_bStoreIsUtf8(a_bStoreIsUtf8) { }